

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Serializer.cpp
# Opt level: O0

void __thiscall adios2::format::BP5Serializer::BP5Serializer(BP5Serializer *this)

{
  undefined8 *in_RDI;
  BP5Base *in_stack_ffffffffffffffc0;
  
  BP5Base::BP5Base(in_stack_ffffffffffffffc0);
  *in_RDI = &VTT;
  in_RDI[1] = 0;
  *(undefined4 *)(in_RDI + 2) = 1;
  in_RDI[3] = 0;
  in_RDI[4] = 1;
  in_RDI[5] = 0x20;
  in_RDI[6] = 0;
  std::vector<_FMFormatBody_*,_std::allocator<_FMFormatBody_*>_>::vector
            ((vector<_FMFormatBody_*,_std::allocator<_FMFormatBody_*>_> *)0xd0e4de);
  std::
  vector<adios2::format::BP5Serializer::DeferredExtern,_std::allocator<adios2::format::BP5Serializer::DeferredExtern>_>
  ::vector((vector<adios2::format::BP5Serializer::DeferredExtern,_std::allocator<adios2::format::BP5Serializer::DeferredExtern>_>
            *)0xd0e4f1);
  std::
  vector<adios2::format::BP5Serializer::DeferredSpanMinMax,_std::allocator<adios2::format::BP5Serializer::DeferredSpanMinMax>_>
  ::vector((vector<adios2::format::BP5Serializer::DeferredSpanMinMax,_std::allocator<adios2::format::BP5Serializer::DeferredSpanMinMax>_>
            *)0xd0e504);
  in_RDI[0x10] = 0;
  FFSWriterMarshalBase::FFSWriterMarshalBase((FFSWriterMarshalBase *)0xd0e525);
  in_RDI[0x22] = 0;
  *(undefined1 *)(in_RDI + 0x23) = 0;
  in_RDI[0x24] = 0;
  in_RDI[0x25] = 0;
  std::
  vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  ::vector((vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
            *)0xd0e563);
  in_RDI[0x29] = 0;
  Init(this);
  return;
}

Assistant:

BP5Serializer::BP5Serializer() { Init(); }